

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall
KktCheck::setIndexVectors
          (KktCheck *this,vector<int,_std::allocator<int>_> *rIndex,
          vector<int,_std::allocator<int>_> *cIndex)

{
  pointer piVar1;
  undefined8 in_RAX;
  size_t i;
  ulong uVar2;
  size_t i_1;
  undefined8 local_38;
  
  piVar1 = (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_38 = in_RAX;
  for (uVar2 = 0;
      piVar1 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    if (piVar1[uVar2] != -1) {
      local_38 = CONCAT44((int)uVar2,(int)local_38);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->rIndexRev,(int *)((long)&local_38 + 4));
    }
  }
  for (uVar2 = 0;
      piVar1 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    if (piVar1[uVar2] != -1) {
      local_38 = CONCAT44(local_38._4_4_,(int)uVar2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->cIndexRev,(int *)&local_38);
    }
  }
  return;
}

Assistant:

void KktCheck::setIndexVectors(vector<int>& rIndex, vector<int>& cIndex){
	rIndexRev.clear();
	cIndexRev.clear();

	for (size_t i=0;i<rIndex.size(); i++) {
		if (rIndex[i] != -1) {
			rIndexRev.push_back(i);
		}
	}
	for (size_t i=0;i<cIndex.size(); i++) {
		if (cIndex[i] != -1) {
			cIndexRev.push_back(i);
		}
	}

}